

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackFrame.c
# Opt level: O2

void sysbvm_stackFrame_printStackTrace(sysbvm_context_t *context,sysbvm_tuple_t stackTrace)

{
  sysbvm_tuple_t sVar1;
  ulong uVar2;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  bool bVar5;
  
  bVar5 = (stackTrace & 0xf) != 0;
  if (bVar5 || stackTrace == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (ulong)(*(uint *)(stackTrace + 0xc) >> 3);
  }
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    if (bVar5 || stackTrace == 0) {
      sVar1 = 0;
    }
    else {
      sVar1 = *(sysbvm_tuple_t *)(stackTrace + 0x10 + uVar4 * 8);
    }
    sVar1 = sysbvm_tuple_asString(context,sVar1);
    uVar2 = 0;
    if ((sVar1 & 0xf) == 0 && sVar1 != 0) {
      uVar2 = (ulong)*(uint *)(sVar1 + 0xc);
    }
    fprintf(_stderr,"%.*s\n",uVar2,sVar1 + 0x10);
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_stackFrame_printStackTrace(sysbvm_context_t *context, sysbvm_tuple_t stackTrace)
{
    size_t stackTraceSize = sysbvm_array_getSize(stackTrace);
    for(size_t i = 0; i < stackTraceSize; ++i)
    {
        sysbvm_tuple_t stackTraceRecord = sysbvm_array_at(stackTrace, i);
        sysbvm_tuple_t stackTraceRecordString = sysbvm_tuple_asString(context, stackTraceRecord);
        fprintf(stderr, SYSBVM_STRING_PRINTF_FORMAT "\n", SYSBVM_STRING_PRINTF_ARG(stackTraceRecordString));
    }
}